

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

ExprPtr __thiscall pegmatite::debug(pegmatite *this,function<void_()> *fn)

{
  Expr *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ExprPtr EVar2;
  _Any_data local_40;
  _Manager_type local_30;
  
  __p = (Expr *)operator_new(0x28);
  std::function<void_()>::function((function<void_()> *)&local_40,fn);
  __p->_vptr_Expr = (_func_int **)&PTR__DebugExpr_001581f0;
  std::function<void_()>::function((function<void_()> *)(__p + 1),(function<void_()> *)&local_40);
  *(Expr **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<pegmatite::Expr*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var1._M_pi = extraout_RDX;
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
    _Var1._M_pi = extraout_RDX_00;
  }
  EVar2.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  EVar2.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar2.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr debug(std::function<void()> fn)
{
	return ExprPtr(new DebugExpr(fn));
}